

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::PathTypeHandlerBase::SetAttributes
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,
          PropertyAttributes attributes)

{
  bool bVar1;
  uint16 uVar2;
  PropertyIndex index;
  int iVar3;
  uint32 uVar4;
  ScriptContext *pSVar5;
  DynamicTypeHandler *pDVar6;
  TypePath *this_00;
  PropertyRecord *this_01;
  undefined4 extraout_var;
  PropertyRecord *propertyRecord;
  PropertyIndex propertyIndex;
  PropertyAttributes attributes_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  
  bVar1 = ObjectSlotAttributesContains(attributes);
  if ((!bVar1) ||
     (bVar1 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,ShareTypesWithAttributesPhase), bVar1)) {
    pSVar5 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
    pSVar5->convertPathToDictionaryAttributesCount =
         pSVar5->convertPathToDictionaryAttributesCount + 1;
    uVar2 = GetPathLength(this);
    pDVar6 = TryConvertToSimpleDictionaryType(this,instance,(uint)uVar2,false);
    this_local._4_4_ =
         (*pDVar6->_vptr_DynamicTypeHandler[0x3b])
                   (pDVar6,instance,(ulong)(uint)propertyId,(ulong)attributes);
  }
  else {
    this_00 = GetTypePath(this);
    uVar2 = GetPathLength(this);
    index = TypePath::LookupInline(this_00,propertyId,(uint)uVar2);
    if (index == 0xffff) {
      bVar1 = DynamicObject::HasObjectArray(instance);
      if ((bVar1) && (attributes != '\a')) {
        pSVar5 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
        this_01 = ScriptContext::GetPropertyName(pSVar5,propertyId);
        bVar1 = PropertyRecord::IsNumeric(this_01);
        if (bVar1) {
          iVar3 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x48])(this,instance);
          uVar4 = PropertyRecord::GetNumericValue(this_01);
          (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x178))
                    ((long *)CONCAT44(extraout_var,iVar3),instance,uVar4,attributes);
        }
      }
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = SetAttributesAtIndex(this,instance,propertyId,index,attributes);
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL PathTypeHandlerBase::SetAttributes(DynamicObject* instance, PropertyId propertyId, PropertyAttributes attributes)
    {
        if (!ObjectSlotAttributesContains(attributes) || PHASE_OFF1(ShareTypesWithAttributesPhase))
        {
#ifdef PROFILE_TYPES
            instance->GetScriptContext()->convertPathToDictionaryAttributesCount++;
#endif

            return TryConvertToSimpleDictionaryType(instance, GetPathLength())->SetAttributes(instance, propertyId, attributes);
        }

        PropertyIndex propertyIndex = GetTypePath()->LookupInline(propertyId, GetPathLength());
        if (propertyIndex == Constants::NoSlot)
        {
            if (instance->HasObjectArray() && attributes != PropertyDynamicTypeDefaults)
            {
                const PropertyRecord * propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
                if (propertyRecord->IsNumeric())
                {
                    this->ConvertToTypeWithItemAttributes(instance)->SetItemAttributes(instance, propertyRecord->GetNumericValue(), attributes);
                }
            }
            return true;
        }

        return SetAttributesAtIndex(instance, propertyId, propertyIndex, attributes);
    }